

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O0

bool __thiscall
cmConditionEvaluator::HandleLevel4
          (cmConditionEvaluator *this,cmArgumentList *newArgs,string *errorString,
          MessageType *status)

{
  CurrentAndTwoMoreIter args_00;
  static_string_view key_1;
  static_string_view key;
  bool bVar1;
  reference pcVar2;
  CurrentAndTwoMoreIter local_a8;
  _List_node_base *local_90;
  _List_node_base *local_88;
  _List_node_base *local_80;
  undefined1 local_73;
  undefined1 local_72;
  byte local_71;
  bool result;
  bool rhs;
  size_t sStack_70;
  bool lhs;
  char *local_68;
  size_t local_60;
  char *local_58;
  int local_4c;
  iterator iStack_48;
  int matchNo;
  undefined1 local_40 [8];
  CurrentAndTwoMoreIter args;
  MessageType *status_local;
  string *errorString_local;
  cmArgumentList *newArgs_local;
  cmConditionEvaluator *this_local;
  
  args.nextnext._M_node = (_List_node_base *)status;
  cmArgumentList::make3ArgsIterator((CurrentAndTwoMoreIter *)local_40,newArgs);
  while( true ) {
    iStack_48 = std::__cxx11::
                list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::end
                          (&newArgs->
                            super_list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                          );
    bVar1 = std::operator!=(&args.next,&stack0xffffffffffffffb8);
    if (!bVar1) break;
    pcVar2 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&args.current);
    local_60 = (anonymous_namespace)::keyAND;
    local_58 = DAT_01805df0;
    sStack_70 = (anonymous_namespace)::keyOR;
    local_68 = DAT_01805f20;
    key.super_string_view._M_str = DAT_01805df0;
    key.super_string_view._M_len = (anonymous_namespace)::keyAND;
    key_1.super_string_view._M_str = DAT_01805f20;
    key_1.super_string_view._M_len = (anonymous_namespace)::keyOR;
    local_4c = matchKeys<cm::static_string_view,cm::static_string_view>(this,pcVar2,key,key_1);
    if (local_4c != 0) {
      pcVar2 = std::_List_iterator<cmExpandedCommandArgument>::operator*
                         ((_List_iterator<cmExpandedCommandArgument> *)local_40);
      local_71 = GetBooleanValueWithAutoDereference
                           (this,pcVar2,errorString,(MessageType *)args.nextnext._M_node,false);
      pcVar2 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&args.next);
      local_72 = GetBooleanValueWithAutoDereference
                           (this,pcVar2,errorString,(MessageType *)args.nextnext._M_node,false);
      local_73 = anon_unknown.dwarf_1b4a0b6::cmRt2CtSelector<std::logical_and,_std::logical_or>::
                 eval<bool>(local_4c,(bool)(local_71 & 1),(bool)local_72);
      local_90 = (_List_node_base *)local_40;
      local_88 = args.current._M_node;
      local_80 = args.next._M_node;
      args_00.next._M_node = args.current._M_node;
      args_00.current._M_node = (_List_node_base *)local_40;
      args_00.nextnext._M_node = args.next._M_node;
      cmArgumentList::ReduceTwoArgs(newArgs,(bool)local_73,args_00);
    }
    cmArgumentList::CurrentAndTwoMoreIter::advance
              (&local_a8,(CurrentAndTwoMoreIter *)local_40,
               &newArgs->
                super_list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>);
  }
  return true;
}

Assistant:

bool cmConditionEvaluator::HandleLevel4(cmArgumentList& newArgs,
                                        std::string& errorString,
                                        MessageType& status)
{
  for (auto args = newArgs.make3ArgsIterator(); args.nextnext != newArgs.end();
       args.advance(newArgs)) {

    int matchNo;

    if ((matchNo = this->matchKeys(*args.next, keyAND, keyOR))) {
      const auto lhs = this->GetBooleanValueWithAutoDereference(
        *args.current, errorString, status);
      const auto rhs = this->GetBooleanValueWithAutoDereference(
        *args.nextnext, errorString, status);
      // clang-format off
      const auto result =
        cmRt2CtSelector<
            std::logical_and, std::logical_or
          >::eval(matchNo, lhs, rhs);
      // clang-format on
      newArgs.ReduceTwoArgs(result, args);
    }
  }
  return true;
}